

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,Terminator *term,void *data)

{
  LexicalScoping LVar1;
  int iVar2;
  GenerateFunction *pGVar3;
  Function *this_00;
  uint uVar4;
  uint uVar5;
  anon_union_8_2_010d16d7_for_TokenDetail_0 in_RAX;
  iterator iVar6;
  Instruction IVar7;
  uint register_id;
  GenerateBlock *pGVar8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_38;
  
  register_id = *data;
  uVar4 = *(uint *)((long)data + 4);
  pGVar3 = this->current_function_;
  this_00 = pGVar3->function_;
  if (term->semantic_ == SemanticOp_Write) {
    if ((term->token_).token_ != 0x115) {
      __assert_fail("term->token_.token_ == Token_Id",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x4c5,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
    }
    if (register_id + 1 == uVar4) {
      LVar1 = term->scoping_;
      if (LVar1 != LexicalScoping_Local) {
        if (LVar1 == LexicalScoping_Upvalue) {
          uVar4 = PrepareUpvalue(this,(term->token_).field_0.str_);
          IVar7.opcode_ = (register_id & 0xff) * 0x10000 + (uVar4 & 0xff) * 0x100 + 0x8000000;
        }
        else {
          if (LVar1 != LexicalScoping_Global) {
            return;
          }
          uVar4 = Function::AddConstString(this_00,(term->token_).field_0.str_);
          IVar7.opcode_ = (register_id & 0xff) * 0x10000 + (uVar4 & 0xffff) + 0xa000000;
        }
        Function::AddInstruction(this_00,IVar7,(term->token_).line_);
        return;
      }
      local_38 = (term->token_).field_0;
      pGVar8 = (GenerateBlock *)&pGVar3->current_block_;
      do {
        pGVar8 = pGVar8->parent_;
        if (pGVar8 == (GenerateBlock *)0x0) {
          __assert_fail("local",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                        ,0x4d0,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)"
                       );
        }
        iVar6 = std::
                _Hashtable<luna::String_*,_std::pair<luna::String_*const,_luna::LocalNameInfo>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>,_std::__detail::_Select1st,_std::equal_to<luna::String_*>,_std::hash<luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(pGVar8->names_)._M_h,&local_38.str_);
      } while (iVar6.
               super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
               ._M_cur == (__node_type *)0x0);
      Function::AddInstruction
                (this_00,(Instruction)
                         ((register_id & 0xff) * 0x100 +
                          (*(uint *)((long)iVar6.
                                           super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                                           ._M_cur + 0x10) & 0xff) * 0x10000 + 0x6000000),
                 (term->token_).line_);
      return;
    }
    __assert_fail("register_id + 1 == end_register",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                  ,0x4c6,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)");
  }
  if ((uVar4 - register_id == 0 || (int)uVar4 < (int)register_id) &&
      (uVar4 != 0xffffffff && term->semantic_ == SemanticOp_Read)) {
    return;
  }
  iVar2 = (term->token_).token_;
  local_38 = in_RAX;
  switch(iVar2) {
  case 0x112:
switchD_001358fc_caseD_112:
    IVar7.opcode_ = (register_id & 0xff) * 0x10000 + (uint)(iVar2 == 0x112) * 0x100 + 0x3000000;
    break;
  case 0x113:
  case 0x114:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
    goto switchD_001358fc_caseD_113;
  case 0x115:
    LVar1 = term->scoping_;
    if (LVar1 == LexicalScoping_Local) {
      local_38 = (term->token_).field_0;
      pGVar8 = (GenerateBlock *)&pGVar3->current_block_;
      do {
        pGVar8 = pGVar8->parent_;
        if (pGVar8 == (GenerateBlock *)0x0) {
          __assert_fail("local",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                        ,0x4fb,"virtual void luna::CodeGenerateVisitor::Visit(Terminator *, void *)"
                       );
        }
        iVar6 = std::
                _Hashtable<luna::String_*,_std::pair<luna::String_*const,_luna::LocalNameInfo>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>,_std::__detail::_Select1st,_std::equal_to<luna::String_*>,_std::hash<luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(pGVar8->names_)._M_h,&local_38.str_);
      } while (iVar6.
               super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
               ._M_cur == (__node_type *)0x0);
      IVar7.opcode_ =
           (register_id & 0xff) * 0x10000 +
           (*(uint *)((long)iVar6.
                            super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                            ._M_cur + 0x10) & 0xff) * 0x100 + 0x6000000;
    }
    else if (LVar1 == LexicalScoping_Upvalue) {
      uVar5 = PrepareUpvalue(this,(term->token_).field_0.str_);
      IVar7.opcode_ = (register_id & 0xff) * 0x10000 + (uVar5 & 0xff) * 0x100 + 0x7000000;
    }
    else {
      if (LVar1 != LexicalScoping_Global) goto switchD_001358fc_caseD_113;
      uVar5 = Function::AddConstString(this_00,(term->token_).field_0.str_);
      IVar7.opcode_ = (register_id & 0xff) * 0x10000 + (uVar5 & 0xffff) + 0x9000000;
    }
    break;
  case 0x116:
    uVar5 = Function::AddConstString(this_00,(term->token_).field_0.str_);
    goto LAB_00135a3a;
  case 0x117:
    uVar5 = Function::AddConstNumber(this_00,(term->token_).field_0.number_);
LAB_00135a3a:
    IVar7.opcode_ = (register_id & 0xff) * 0x10000 + (uVar5 & 0xffff) + 0x5000000;
    break;
  case 0x11d:
    uVar5 = uVar4 - register_id & 0xffff;
    if (uVar4 == 0xffffffff) {
      uVar5 = 0xffff;
    }
    Function::AddInstruction
              (this_00,(Instruction)((register_id & 0xff) * 0x10000 + uVar5 + 0xd000000),
               (term->token_).line_);
    register_id = uVar4;
    goto switchD_001358fc_caseD_113;
  default:
    if (iVar2 == 0x106) goto switchD_001358fc_caseD_112;
    if (iVar2 != 0x10c) goto switchD_001358fc_caseD_113;
    IVar7.opcode_ = (register_id & 0xff) << 0x10 | 0x1000000;
  }
  Function::AddInstruction(this_00,IVar7,(term->token_).line_);
  register_id = register_id + 1;
switchD_001358fc_caseD_113:
  FillRemainRegisterNil(this,register_id,uVar4,(term->token_).line_);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(Terminator *term, void *data)
    {
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;
        auto function = GetCurrentFunction();

        // Generate code for SemanticOp_Write
        if (term->semantic_ == SemanticOp_Write)
        {
            assert(term->token_.token_ == Token_Id);
            assert(register_id + 1 == end_register);
            if (term->scoping_ == LexicalScoping_Global)
            {
                auto index = function->AddConstString(term->token_.str_);
                auto instruction = Instruction::ABxCode(OpType_SetGlobal, register_id, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Local)
            {
                auto local = SearchLocalName(term->token_.str_);
                assert(local);
                auto instruction = Instruction::ABCode(OpType_Move, local->register_id_, register_id);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Upvalue)
            {
                auto index = PrepareUpvalue(term->token_.str_);
                auto instruction = Instruction::ABCode(OpType_SetUpvalue, register_id, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            return ;
        }

        // Generate code for SemanticOp_Read
        // Just return when term is SemanticOp_Read and no registers to fill
        if (term->semantic_ == SemanticOp_Read &&
            end_register != EXP_VALUE_COUNT_ANY && register_id >= end_register)
            return ;

        if (term->token_.token_ == Token_Number || term->token_.token_ == Token_String)
        {
            // Load const to register
            auto index = 0;
            if (term->token_.token_ == Token_Number)
                index = function->AddConstNumber(term->token_.number_);
            else
                index = function->AddConstString(term->token_.str_);
            auto instruction = Instruction::ABxCode(OpType_LoadConst, register_id++, index);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_Id)
        {
            if (term->scoping_ == LexicalScoping_Global)
            {
                // Get value from global table by key index
                auto index = function->AddConstString(term->token_.str_);
                auto instruction = Instruction::ABxCode(OpType_GetGlobal, register_id++, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Local)
            {
                // Load local variable value to dst register
                auto local = SearchLocalName(term->token_.str_);
                assert(local);
                auto instruction = Instruction::ABCode(OpType_Move, register_id++, local->register_id_);
                function->AddInstruction(instruction, term->token_.line_);
            }
            else if (term->scoping_ == LexicalScoping_Upvalue)
            {
                // Get upvalue index
                auto index = PrepareUpvalue(term->token_.str_);
                auto instruction = Instruction::ABCode(OpType_GetUpvalue, register_id++, index);
                function->AddInstruction(instruction, term->token_.line_);
            }
        }
        else if (term->token_.token_ == Token_True || term->token_.token_ == Token_False)
        {
            auto bvalue = term->token_.token_ == Token_True ? 1 : 0;
            auto instruction = Instruction::ABCode(OpType_LoadBool, register_id++, bvalue);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_Nil)
        {
            auto instruction = Instruction::ACode(OpType_LoadNil, register_id++);
            function->AddInstruction(instruction, term->token_.line_);
        }
        else if (term->token_.token_ == Token_VarArg)
        {
            // Copy vararg to registers which start from register_id
            auto expect_results = end_register == EXP_VALUE_COUNT_ANY ?
                EXP_VALUE_COUNT_ANY : end_register - register_id;
            auto instruction = Instruction::AsBxCode(OpType_VarArg, register_id, expect_results);
            function->AddInstruction(instruction, term->token_.line_);

            // All registers will be filled when executing, so do not
            // fill nil to remain registers
            register_id = end_register;
        }

        FillRemainRegisterNil(register_id, end_register, term->token_.line_);
    }